

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O3

vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
* anon_unknown.dwarf_1461ac2::ParsePubkey
            (vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
             *__return_storage_ptr__,uint32_t key_exp_index,Span<const_char> *sp,
            ParseScriptContext ctx,FlatSigningProvider *out,string *error)

{
  PubkeyProvider *pPVar1;
  pointer puVar2;
  bool bVar3;
  char cVar4;
  pointer *__ptr;
  OriginPubkeyProvider *pOVar5;
  ulong uVar6;
  pointer puVar7;
  pointer puVar8;
  undefined8 uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  ulong uVar10;
  pointer puVar11;
  _Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *this;
  ulong uVar13;
  pointer __p;
  pointer puVar14;
  long in_FS_OFFSET;
  string_view hex_str;
  string_view separators;
  string_view separators_00;
  string_view str;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  providers;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  path;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fpr_bytes;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> slash_split;
  bool apostrophe;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> origin_split;
  KeyOriginInfo info;
  string fpr_hex;
  pointer local_168;
  _Head_base<0UL,_(anonymous_namespace)::OriginPubkeyProvider_*,_false> local_148;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  local_140;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_128;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> local_f0;
  bool local_d1;
  vector<Span<const_char>,_std::allocator<Span<const_char>_>_> local_d0;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  local_b8;
  undefined4 local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  size_t local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_48;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  *local_38;
  FlatSigningProvider *pFVar12;
  
  local_38 = *(vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
               **)(in_FS_OFFSET + 0x28);
  local_b8.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58[0] = 0x5d;
  separators._M_str = (char *)out;
  separators._M_len = (size_t)local_58;
  pFVar12 = out;
  util::Split<Span<char_const>>(&local_d0,(util *)sp,(Span<const_char> *)0x1,separators);
  if ((ulong)((long)local_d0.
                    super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl
                    .super__Vector_impl_data._M_finish -
             (long)local_d0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    local_d1 = false;
    if ((long)local_d0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_d0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0x10) {
      ParsePubkeyInner(__return_storage_ptr__,key_exp_index,
                       local_d0.
                       super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                       _M_impl.super__Vector_impl_data._M_start,ctx,out,&local_d1,error);
    }
    else {
      if ((local_d0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl
           .super__Vector_impl_data._M_start)->m_size == 0) {
        cVar4 = ']';
      }
      else {
        if (*(local_d0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
              _M_impl.super__Vector_impl_data._M_start)->m_data == '[') {
          local_58._0_8_ =
               (local_d0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                _M_impl.super__Vector_impl_data._M_start)->m_data + 1;
          local_58._8_8_ =
               (local_d0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                _M_impl.super__Vector_impl_data._M_start)->m_size - 1;
          local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT71(local_78._1_7_,0x2f);
          separators_00._M_str = (char *)pFVar12;
          separators_00._M_len = (size_t)&local_78;
          util::Split<Span<char_const>>
                    (&local_f0,(util *)local_58,(Span<const_char> *)0x1,separators_00);
          args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_f0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                  _M_impl.super__Vector_impl_data._M_start)->m_size;
          if (args == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x8) {
            local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
            ;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,
                       (local_f0.
                        super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                        _M_impl.super__Vector_impl_data._M_start)->m_data,
                       (local_f0.
                        super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                        _M_impl.super__Vector_impl_data._M_start)->m_data + 8);
            str._M_str = (char *)local_78;
            str._M_len = local_70;
            bVar3 = IsHex(str);
            if (bVar3) {
              hex_str._M_str = (char *)local_78;
              hex_str._M_len = local_70;
              ParseHex<unsigned_char>(&local_108,hex_str);
              local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if ((long)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start != 4) {
LAB_0039423b:
                __assert_fail("fpr_bytes.size() == 4",
                              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/descriptor.cpp"
                              ,0x653,
                              "std::vector<std::unique_ptr<PubkeyProvider>> (anonymous namespace)::ParsePubkey(uint32_t, const Span<const char> &, ParseScriptContext, FlatSigningProvider &, std::string &)"
                             );
              }
              if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
                local_98 = *(undefined4 *)
                            local_108.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
              }
              local_128.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
              local_128.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
              local_128.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              bVar3 = ParseKeyPath(&local_f0,&local_128,&local_d1,error,false);
              if (bVar3) {
                if (local_128.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    local_128.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  if (*(vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                        **)(in_FS_OFFSET + 0x28) == local_38) {
                    uVar9 = std::__throw_out_of_range_fmt
                                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                       ,0,0);
                    std::
                    vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                    ::~vector(&local_140);
                    std::
                    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ::~vector(&local_128);
                    if (local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_90.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_90.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_90.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_108.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_108.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_108.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (local_78 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_68) {
                      operator_delete(local_78,(ulong)(local_68._0_8_ + 1));
                    }
                    if (local_f0.
                        super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_f0.
                                      super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_f0.
                                            super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_f0.
                                            super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    if (local_d0.
                        super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                        _M_impl.super__Vector_impl_data._M_start != (Span<const_char> *)0x0) {
                      operator_delete(local_d0.
                                      super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_d0.
                                            super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_d0.
                                            super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                    std::
                    vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                    ::~vector(&local_b8);
                    if (*(vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                          **)(in_FS_OFFSET + 0x28) == local_38) {
                      _Unwind_Resume(uVar9);
                    }
                  }
                  goto LAB_00394427;
                }
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                          (&local_90,
                           local_128.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
                ParsePubkeyInner(&local_140,key_exp_index,
                                 local_d0.
                                 super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 1,ctx,out,&local_d1,
                                 error);
                if (local_140.
                    super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                    local_140.
                    super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  std::
                  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                  ::reserve(&local_b8,
                            (long)local_140.
                                  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_140.
                                  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3);
                  bVar3 = local_d1;
                  local_168 = local_b8.
                              super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                  puVar11 = local_140.
                            super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  do {
                    pOVar5 = (OriginPubkeyProvider *)operator_new(0x40);
                    local_58._0_4_ = local_98;
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_58 + 8)
                               ,&local_90);
                    puVar2 = local_b8.
                             super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                    pPVar1 = (puVar11->_M_t).
                             super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                             .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>.
                             _M_head_impl;
                    (puVar11->_M_t).
                    super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>.
                    _M_head_impl = (PubkeyProvider *)0x0;
                    *(uint32_t *)((long)&pOVar5->super_PubkeyProvider + 8) = key_exp_index;
                    (pOVar5->super_PubkeyProvider)._vptr_PubkeyProvider =
                         (_func_int **)&PTR__OriginPubkeyProvider_006bedb0;
                    *(undefined4 *)&((PubkeyProvider *)&pOVar5->m_origin)->_vptr_PubkeyProvider =
                         local_58._0_4_;
                    *(undefined8 *)&((PubkeyProvider *)&pOVar5->m_origin)->m_expr_index =
                         local_58._8_8_;
                    ((PubkeyProvider *)((long)&pOVar5->m_origin + 0x10))->_vptr_PubkeyProvider =
                         (_func_int **)aStack_48._M_allocated_capacity;
                    *(undefined8 *)
                     &((PubkeyProvider *)((long)&pOVar5->m_origin + 0x10))->m_expr_index =
                         aStack_48._8_8_;
                    ((PubkeyProvider *)&pOVar5->m_provider)->_vptr_PubkeyProvider =
                         (_func_int **)pPVar1;
                    *(bool *)&((PubkeyProvider *)&pOVar5->m_apostrophe)->_vptr_PubkeyProvider =
                         bVar3;
                    if (local_b8.
                        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish ==
                        local_b8.
                        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      uVar13 = (long)local_b8.
                                     super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)local_168;
                      local_148._M_head_impl = pOVar5;
                      if (uVar13 == 0x7ffffffffffffff8) {
                        local_b8.
                        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start = local_168;
                        if (*(vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                              **)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00394427;
                        std::__throw_length_error("vector::_M_realloc_insert");
                        goto LAB_0039423b;
                      }
                      uVar6 = (long)uVar13 >> 3;
                      uVar10 = uVar6;
                      if (local_b8.
                          super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish == local_168) {
                        uVar10 = 1;
                      }
                      this = (_Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                              *)(uVar10 + uVar6);
                      if ((_Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                           *)0xffffffffffffffe < this) {
                        this = (_Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                                *)0xfffffffffffffff;
                      }
                      if (CARRY8(uVar10,uVar6)) {
                        this = (_Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                                *)0xfffffffffffffff;
                      }
                      puVar7 = std::
                               _Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                               ::_M_allocate(this,0xfffffffffffffff);
                      local_148._M_head_impl = (OriginPubkeyProvider *)0x0;
                      *(OriginPubkeyProvider **)((long)puVar7 + uVar13) = pOVar5;
                      puVar14 = puVar7;
                      for (puVar8 = local_168; puVar2 != puVar8; puVar8 = puVar8 + 1) {
                        (puVar14->_M_t).
                        super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                        .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>.
                        _M_head_impl = (puVar8->_M_t).
                                       super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                                       .
                                       super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>
                                       ._M_head_impl;
                        (puVar8->_M_t).
                        super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                        .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>.
                        _M_head_impl = (PubkeyProvider *)0x0;
                        puVar14 = puVar14 + 1;
                      }
                      if (local_168 != (pointer)0x0) {
                        operator_delete(local_168,uVar13);
                      }
                      local_b8.
                      super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = puVar7 + (long)this;
                      local_168 = puVar7;
                    }
                    else {
                      local_148._M_head_impl = (OriginPubkeyProvider *)0x0;
                      ((local_b8.
                        super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                      super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
                      .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>.
                      _M_head_impl = (PubkeyProvider *)pOVar5;
                      puVar14 = local_b8.
                                super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                    }
                    puVar2 = local_b8.
                             super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                    local_b8.
                    super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = puVar14 + 1;
                    std::
                    unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
                    ::~unique_ptr((unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
                                   *)&local_148);
                    puVar11 = puVar11 + 1;
                  } while (puVar11 !=
                           local_140.
                           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
                  (__return_storage_ptr__->
                  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start = local_168;
                  (__return_storage_ptr__->
                  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish = puVar14 + 1;
                  (__return_storage_ptr__->
                  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage = puVar2;
                  __return_storage_ptr__ = &local_b8;
                }
                (__return_storage_ptr__->
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                (__return_storage_ptr__->
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                (__return_storage_ptr__->
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::
                vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                ::~vector(&local_140);
              }
              else {
                (__return_storage_ptr__->
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                (__return_storage_ptr__->
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                (__return_storage_ptr__->
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              }
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::~vector(&local_128);
              if (local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_90.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_90.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_90.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_108.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_108.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_108.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
            else {
              tinyformat::format<std::__cxx11::string>
                        ((string *)local_58,(tinyformat *)"Fingerprint \'%s\' is not hex",
                         (char *)&local_78,args);
              _GLOBAL__N_1::ParsePubkey();
            }
            if (local_78 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68) {
              operator_delete(local_78,(ulong)(local_68._0_8_ + 1));
            }
          }
          else {
            local_78 = args;
            tinyformat::format<unsigned_long>
                      ((string *)local_58,
                       "Fingerprint is not 4 bytes (%u characters instead of 8 characters)",
                       (unsigned_long *)&local_78);
            _GLOBAL__N_1::ParsePubkey();
          }
          if (local_f0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_f0.
                            super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_f0.
                                  super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_f0.
                                  super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          goto LAB_00394103;
        }
        cVar4 = *(local_d0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                  _M_impl.super__Vector_impl_data._M_start)->m_data;
      }
      local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71(local_78._1_7_,cVar4);
      tinyformat::format<char>
                ((string *)local_58,
                 "Key origin start \'[ character expected but not found, got \'%c\' instead",
                 (char *)&local_78);
      _GLOBAL__N_1::ParsePubkey();
    }
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (error,0,error->_M_string_length,"Multiple \']\' characters found for a single pubkey"
               ,0x31);
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
LAB_00394103:
  if (local_d0.super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl.
      super__Vector_impl_data._M_start != (Span<const_char> *)0x0) {
    operator_delete(local_d0.
                    super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_d0.
                          super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.
                          super__Vector_base<Span<const_char>,_std::allocator<Span<const_char>_>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::~vector(&local_b8);
  if (*(vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
        **)(in_FS_OFFSET + 0x28) == local_38) {
    return *(vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
             **)(in_FS_OFFSET + 0x28);
  }
LAB_00394427:
  __stack_chk_fail();
}

Assistant:

std::vector<std::unique_ptr<PubkeyProvider>> ParsePubkey(uint32_t key_exp_index, const Span<const char>& sp, ParseScriptContext ctx, FlatSigningProvider& out, std::string& error)
{
    std::vector<std::unique_ptr<PubkeyProvider>> ret;
    auto origin_split = Split(sp, ']');
    if (origin_split.size() > 2) {
        error = "Multiple ']' characters found for a single pubkey";
        return {};
    }
    // This is set if either the origin or path suffix contains a hardened derivation.
    bool apostrophe = false;
    if (origin_split.size() == 1) {
        return ParsePubkeyInner(key_exp_index, origin_split[0], ctx, out, apostrophe, error);
    }
    if (origin_split[0].empty() || origin_split[0][0] != '[') {
        error = strprintf("Key origin start '[ character expected but not found, got '%c' instead",
                          origin_split[0].empty() ? /** empty, implies split char */ ']' : origin_split[0][0]);
        return {};
    }
    auto slash_split = Split(origin_split[0].subspan(1), '/');
    if (slash_split[0].size() != 8) {
        error = strprintf("Fingerprint is not 4 bytes (%u characters instead of 8 characters)", slash_split[0].size());
        return {};
    }
    std::string fpr_hex = std::string(slash_split[0].begin(), slash_split[0].end());
    if (!IsHex(fpr_hex)) {
        error = strprintf("Fingerprint '%s' is not hex", fpr_hex);
        return {};
    }
    auto fpr_bytes = ParseHex(fpr_hex);
    KeyOriginInfo info;
    static_assert(sizeof(info.fingerprint) == 4, "Fingerprint must be 4 bytes");
    assert(fpr_bytes.size() == 4);
    std::copy(fpr_bytes.begin(), fpr_bytes.end(), info.fingerprint);
    std::vector<KeyPath> path;
    if (!ParseKeyPath(slash_split, path, apostrophe, error, /*allow_multipath=*/false)) return {};
    info.path = path.at(0);
    auto providers = ParsePubkeyInner(key_exp_index, origin_split[1], ctx, out, apostrophe, error);
    if (providers.empty()) return {};
    ret.reserve(providers.size());
    for (auto& prov : providers) {
        ret.emplace_back(std::make_unique<OriginPubkeyProvider>(key_exp_index, info, std::move(prov), apostrophe));
    }
    return ret;
}